

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O0

void __thiscall OpenMD::SimInfo::calcNdf(SimInfo *this)

{
  bool bVar1;
  long in_RDI;
  Atom *atom;
  StuntDouble *sd;
  Molecule *mol;
  iterator k;
  iterator j;
  MoleculeIterator i;
  int nfq_local;
  int ndf_local;
  Atom *in_stack_ffffffffffffffc0;
  StuntDouble *local_38;
  Molecule *local_30;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  in_stack_ffffffffffffffd8;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  in_stack_ffffffffffffffe0;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_18;
  int local_10;
  int local_c;
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_18);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator((__normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
                       *)&stack0xffffffffffffffe0);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator((__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                       *)&stack0xffffffffffffffd8);
  local_c = 0;
  local_10 = 0;
  local_30 = beginMolecule((SimInfo *)in_stack_ffffffffffffffe0._M_current,
                           (MoleculeIterator *)in_stack_ffffffffffffffd8._M_current);
  while (local_30 != (Molecule *)0x0) {
    local_38 = Molecule::beginIntegrableObject
                         ((Molecule *)in_stack_ffffffffffffffe0._M_current,
                          (iterator *)in_stack_ffffffffffffffd8._M_current);
    while (local_38 != (StuntDouble *)0x0) {
      local_c = local_c + 3;
      bVar1 = StuntDouble::isDirectional(&in_stack_ffffffffffffffc0->super_StuntDouble);
      if (bVar1) {
        bVar1 = StuntDouble::isLinear(local_38);
        if (bVar1) {
          local_c = local_c + 2;
        }
        else {
          local_c = local_c + 3;
        }
      }
      local_38 = Molecule::nextIntegrableObject
                           ((Molecule *)in_stack_ffffffffffffffe0._M_current,
                            (iterator *)in_stack_ffffffffffffffd8._M_current);
    }
    in_stack_ffffffffffffffc0 =
         Molecule::beginFluctuatingCharge
                   ((Molecule *)in_stack_ffffffffffffffe0._M_current,
                    (iterator *)in_stack_ffffffffffffffd8._M_current);
    while (in_stack_ffffffffffffffc0 != (Atom *)0x0) {
      bVar1 = Atom::isFluctuatingCharge((Atom *)0x160fce);
      if (bVar1) {
        local_10 = local_10 + 1;
      }
      in_stack_ffffffffffffffc0 =
           Molecule::nextFluctuatingCharge
                     ((Molecule *)in_stack_ffffffffffffffe0._M_current,
                      (iterator *)in_stack_ffffffffffffffd8._M_current);
    }
    local_30 = nextMolecule((SimInfo *)in_stack_ffffffffffffffe0._M_current,
                            (MoleculeIterator *)in_stack_ffffffffffffffd8._M_current);
  }
  *(int *)(in_RDI + 0x84) = local_c;
  *(int *)(in_RDI + 0x80) = local_c - *(int *)(in_RDI + 0x48);
  *(int *)(in_RDI + 100) = local_10;
  *(int *)(in_RDI + 0x80) = (*(int *)(in_RDI + 0x80) + -3) - *(int *)(in_RDI + 0x98);
  return;
}

Assistant:

void SimInfo::calcNdf() {
    int ndf_local, nfq_local;
    MoleculeIterator i;
    vector<StuntDouble*>::iterator j;
    vector<Atom*>::iterator k;

    Molecule* mol;
    StuntDouble* sd;
    Atom* atom;

    ndf_local = 0;
    nfq_local = 0;

    for (mol = beginMolecule(i); mol != NULL; mol = nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        ndf_local += 3;

        if (sd->isDirectional()) {
          if (sd->isLinear()) {
            ndf_local += 2;
          } else {
            ndf_local += 3;
          }
        }
      }

      for (atom = mol->beginFluctuatingCharge(k); atom != NULL;
           atom = mol->nextFluctuatingCharge(k)) {
        if (atom->isFluctuatingCharge()) { nfq_local++; }
      }
    }

    ndfLocal_ = ndf_local;

    // n_constraints is local, so subtract them on each processor
    ndf_local -= nConstraints_;

#ifdef IS_MPI
    MPI_Allreduce(&ndf_local, &ndf_, 1, MPI_INT, MPI_SUM, MPI_COMM_WORLD);
    MPI_Allreduce(&nfq_local, &nGlobalFluctuatingCharges_, 1, MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);
#else
    ndf_                       = ndf_local;
    nGlobalFluctuatingCharges_ = nfq_local;
#endif

    // nZconstraints_ is global, as are the 3 COM translations for the
    // entire system:
    ndf_ = ndf_ - 3 - nZconstraint_;
  }